

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O3

void Ptex::v2_4::(anonymous_namespace)::ApplyS<unsigned_char,2>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int nTxChan)

{
  ushort *puVar1;
  float fVar2;
  byte bVar3;
  float *pfVar4;
  float *pfVar5;
  long lVar6;
  ushort *puVar7;
  ushort *puVar8;
  int iVar9;
  float *pfVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  
  bVar3 = (k->res).ulog2;
  iVar12 = nTxChan << (bVar3 & 0x1f);
  lVar6 = (long)iVar12 * (long)k->vw;
  if ((int)lVar6 != 0) {
    puVar8 = (ushort *)((long)data + (long)(((k->v << (bVar3 & 0x1f)) + k->u) * nTxChan));
    puVar7 = (ushort *)(lVar6 + (long)puVar8);
    pfVar4 = k->ku;
    pfVar10 = k->kv;
    lVar11 = (long)nTxChan;
    lVar6 = k->uw * lVar11;
    iVar9 = (int)lVar6;
    do {
      fVar15 = *pfVar4;
      fVar14 = fVar15 * (float)(*puVar8 & 0xff);
      fVar15 = fVar15 * (float)(byte)(*puVar8 >> 8);
      lVar13 = lVar6;
      pfVar5 = pfVar4;
      if (iVar9 != nTxChan) {
        do {
          puVar1 = (ushort *)((long)puVar8 + lVar11);
          puVar8 = (ushort *)((long)puVar8 + lVar11);
          fVar2 = pfVar5[1];
          fVar14 = fVar14 + fVar2 * (float)(*puVar1 & 0xff);
          fVar15 = fVar15 + fVar2 * (float)(byte)(*puVar1 >> 8);
          lVar13 = lVar13 - lVar11;
          pfVar5 = pfVar5 + 1;
        } while (lVar11 != lVar13);
      }
      puVar8 = (ushort *)((long)puVar8 + (iVar12 - iVar9) + lVar11);
      fVar2 = *pfVar10;
      pfVar10 = pfVar10 + 1;
      *(ulong *)result =
           CONCAT44(fVar2 * fVar15 + (float)((ulong)*(undefined8 *)result >> 0x20),
                    fVar2 * fVar14 + (float)*(undefined8 *)result);
    } while (puVar8 != puVar7);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }